

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O2

void __thiscall AST::LetStmt::~LetStmt(LetStmt *this)

{
  ~LetStmt(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

explicit LetStmt(std::unique_ptr<Identifier> ident, std::unique_ptr<Expr> expr)
        : m_ident(std::move(ident))
        , m_expr(std::move(expr)) { }